

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupHost(vector<CNetAddr,_std::allocator<CNetAddr>_> *__return_storage_ptr__,string *name,
          uint nMaxSolutions,bool fAllowLookup,DNSLookupFn dns_lookup_function)

{
  long lVar1;
  bool bVar2;
  undefined4 in_register_00000014;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_R8;
  long in_FS_OFFSET;
  string_view str;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  fStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string strHost;
  
  str._M_str._4_4_ = in_register_00000014;
  str._M_str._0_4_ = nMaxSolutions;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_len = (size_t)(name->_M_dataplus)._M_p;
  bVar2 = util::ContainsNoNUL((util *)name->_M_string_length,str);
  if (bVar2) {
    std::__cxx11::string::string((string *)&strHost,name);
    if (strHost._M_string_length == 0) {
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      if ((*strHost._M_dataplus._M_p == '[') &&
         (strHost._M_dataplus._M_p[strHost._M_string_length - 1] == ']')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_78,&strHost,1,strHost._M_string_length - 2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&strHost,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function(&fStack_98,in_R8);
      LookupIntern(__return_storage_ptr__,&strHost,nMaxSolutions,fAllowLookup,&fStack_98);
      std::_Function_base::~_Function_base(&fStack_98.super__Function_base);
    }
    std::__cxx11::string::~string((string *)&strHost);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00599a22:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00599a22;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<CNetAddr,_std::allocator<CNetAddr>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CNetAddr> LookupHost(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    std::string strHost = name;
    if (strHost.empty()) return {};
    if (strHost.front() == '[' && strHost.back() == ']') {
        strHost = strHost.substr(1, strHost.size() - 2);
    }

    return LookupIntern(strHost, nMaxSolutions, fAllowLookup, dns_lookup_function);
}